

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.c
# Opt level: O2

void movePack_print_json(MovePack *movePack)

{
  uint uVar1;
  ulong uVar2;
  
  putchar(0x5b);
  uVar1 = 0;
  while( true ) {
    uVar2 = (ulong)(uVar1 & 0xff);
    if (movePack->movesCount <= uVar2) break;
    if (uVar2 != 0) {
      putchar(0x2c);
    }
    move_print_json(movePack->moves[uVar2]);
    uVar1 = (uVar1 & 0xff) + 1;
  }
  putchar(0x5d);
  return;
}

Assistant:

void movePack_print_json(MovePack * movePack)
{
	unsigned char i;
	printf("[");
	for(i=0;i<movePack->movesCount;i++)
	{
		if(i>0)
			printf(",");
		move_print_json(movePack->moves[i]);
	}
	printf("]");
}